

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

_dep * __thiscall
LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>::intl_malloc
          (LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *this)

{
  bool bVar1;
  __pointer_type p;
  _dep *p_Var2;
  atomic<depspawn::internal::Workitem::_dep_*> *in_RDI;
  atomic<depspawn::internal::Workitem::_dep_*> *unaff_retaddr;
  _dep *ret;
  atomic<depspawn::internal::Workitem::_dep_*> *in_stack_ffffffffffffffe0;
  atomic<depspawn::internal::Workitem::_dep_*> *__p1;
  
  __p1 = in_RDI;
  p = std::atomic<depspawn::internal::Workitem::_dep_*>::load
                (in_RDI,(memory_order)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  do {
    while (p_Var2 = clean_ptr(p), p_Var2 == (_dep *)0x0) {
      allocate(this);
      p = std::atomic<depspawn::internal::Workitem::_dep_*>::load
                    (in_RDI,(memory_order)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    }
    in_stack_ffffffffffffffe0 = in_RDI + 4;
    p_Var2 = clean_ptr(p);
    p_Var2 = clean_ptr(p_Var2->next);
    next_ptr(p_Var2,p);
    bVar1 = std::atomic<depspawn::internal::Workitem::_dep_*>::compare_exchange_weak
                      (unaff_retaddr,(__pointer_type *)__p1,p,(memory_order)((ulong)in_RDI >> 0x20))
    ;
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  p_Var2 = clean_ptr(p);
  return p_Var2;
}

Assistant:

T* intl_malloc()
  {
    T* ret = head_.load(std::memory_order_relaxed);
    do {
      while(clean_ptr(ret) == nullptr) {
        allocate();
        ret = head_.load(std::memory_order_relaxed);
      }
    } while(!head_.compare_exchange_weak(ret, next_ptr(clean_ptr(static_cast<T *>(clean_ptr(ret)->next)), ret)));
    
    //Notice that we do not make a new (ret) T()
    return clean_ptr(ret);
  }